

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_4> * __thiscall
tcu::normalize<double,4>(Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *a)

{
  Type TVar1;
  int local_24;
  int i;
  double ooLen;
  Vector<double,_4> *a_local;
  Vector<double,_4> *res;
  
  TVar1 = length<double,4>((Vector<double,_4> *)this);
  Vector<double,_4>::Vector(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    __return_storage_ptr__->m_data[local_24] =
         (1.0 / TVar1) * *(double *)(this + (long)local_24 * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}